

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableStringFieldLiteGenerator::GenerateBuilderMembers
          (RepeatedImmutableStringFieldLiteGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  Printer *pPVar2;
  Options *pOVar3;
  Semantic local_534;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_530;
  string_view local_528;
  string_view local_518;
  string_view local_508;
  Options local_4f8;
  Semantic local_4a4;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_4a0;
  string_view local_498;
  string_view local_488;
  string_view local_478;
  Options local_468;
  Semantic local_414;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_410;
  string_view local_408;
  string_view local_3f8;
  string_view local_3e8;
  Options local_3d8;
  Semantic local_384;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_380;
  string_view local_378;
  string_view local_368;
  string_view local_358;
  Options local_348;
  Semantic local_2f4;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_2f0;
  string_view local_2e8;
  string_view local_2d8;
  string_view local_2c8;
  Options local_2b8;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_260;
  string_view local_258;
  string_view local_248;
  string_view local_238;
  Options local_228;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_1d0;
  string_view local_1c8;
  string_view local_1b8;
  string_view local_1a8;
  Options local_198;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_140;
  string_view local_138;
  string_view local_128;
  string_view local_118;
  Options local_108;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_b0;
  string_view local_a8;
  string_view local_98;
  string_view local_88 [2];
  Options local_68;
  Printer *local_18;
  Printer *printer_local;
  RepeatedImmutableStringFieldLiteGenerator *this_local;
  
  pFVar1 = this->descriptor_;
  local_18 = printer;
  printer_local = (Printer *)this;
  pOVar3 = Context::options(this->context_);
  Options::Options(&local_68,pOVar3);
  WriteFieldAccessorDocComment(printer,pFVar1,LIST_GETTER,&local_68,false,false,false);
  Options::~Options(&local_68);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_88,
             "@java.lang.Override\n$deprecation$public java.util.List<java.lang.String>\n    ${$get$capitalized_name$List$}$() {\n  return java.util.Collections.unmodifiableList(\n      instance.get$capitalized_name$List());\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&this->variables_,local_88[0]);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_98,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,"}");
  pFVar1 = this->descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_b0);
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_98,local_a8,pFVar1,local_b0);
  pPVar2 = local_18;
  pFVar1 = this->descriptor_;
  pOVar3 = Context::options(this->context_);
  Options::Options(&local_108,pOVar3);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,LIST_COUNT,&local_108,false,false,false);
  Options::~Options(&local_108);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_118,
             "@java.lang.Override\n$deprecation$public int ${$get$capitalized_name$Count$}$() {\n  return instance.get$capitalized_name$Count();\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&this->variables_,local_118);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_128,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_138,"}");
  pFVar1 = this->descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_140);
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_128,local_138,pFVar1,local_140);
  pPVar2 = local_18;
  pFVar1 = this->descriptor_;
  pOVar3 = Context::options(this->context_);
  Options::Options(&local_198,pOVar3);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,LIST_INDEXED_GETTER,&local_198,false,false,false);
  Options::~Options(&local_198);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1a8,
             "@java.lang.Override\n$deprecation$public java.lang.String ${$get$capitalized_name$$}$(int index) {\n  return instance.get$capitalized_name$(index);\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&this->variables_,local_1a8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1b8,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1c8,"}");
  pFVar1 = this->descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_1d0);
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_1b8,local_1c8,pFVar1,local_1d0);
  pPVar2 = local_18;
  pFVar1 = this->descriptor_;
  pOVar3 = Context::options(this->context_);
  Options::Options(&local_228,pOVar3);
  WriteFieldStringBytesAccessorDocComment
            (pPVar2,pFVar1,LIST_INDEXED_GETTER,&local_228,false,false,false);
  Options::~Options(&local_228);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_238,
             "@java.lang.Override\n$deprecation$public com.google.protobuf.ByteString\n    ${$get$capitalized_name$Bytes$}$(int index) {\n  return instance.get$capitalized_name$Bytes(index);\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&this->variables_,local_238);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_248,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_258,"}");
  pFVar1 = this->descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_260);
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_248,local_258,pFVar1,local_260);
  pPVar2 = local_18;
  pFVar1 = this->descriptor_;
  pOVar3 = Context::options(this->context_);
  Options::Options(&local_2b8,pOVar3);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,LIST_INDEXED_SETTER,&local_2b8,true,false,false);
  Options::~Options(&local_2b8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_2c8,
             "$deprecation$public Builder ${$set$capitalized_name$$}$(\n    int index, java.lang.String value) {\n  copyOnWrite();\n  instance.set$capitalized_name$(index, value);\n  return this;\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&this->variables_,local_2c8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2d8,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2e8,"}");
  pFVar1 = this->descriptor_;
  local_2f4 = kSet;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>(&local_2f0,&local_2f4);
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_2d8,local_2e8,pFVar1,local_2f0);
  pPVar2 = local_18;
  pFVar1 = this->descriptor_;
  pOVar3 = Context::options(this->context_);
  Options::Options(&local_348,pOVar3);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,LIST_ADDER,&local_348,true,false,false);
  Options::~Options(&local_348);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_358,
             "$deprecation$public Builder ${$add$capitalized_name$$}$(\n    java.lang.String value) {\n  copyOnWrite();\n  instance.add$capitalized_name$(value);\n  return this;\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&this->variables_,local_358);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_368,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_378,"}");
  pFVar1 = this->descriptor_;
  local_384 = kSet;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>(&local_380,&local_384);
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_368,local_378,pFVar1,local_380);
  pPVar2 = local_18;
  pFVar1 = this->descriptor_;
  pOVar3 = Context::options(this->context_);
  Options::Options(&local_3d8,pOVar3);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,LIST_MULTI_ADDER,&local_3d8,true,false,false);
  Options::~Options(&local_3d8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_3e8,
             "$deprecation$public Builder ${$addAll$capitalized_name$$}$(\n    java.lang.Iterable<java.lang.String> values) {\n  copyOnWrite();\n  instance.addAll$capitalized_name$(values);\n  return this;\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&this->variables_,local_3e8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3f8,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_408,"}");
  pFVar1 = this->descriptor_;
  local_414 = kSet;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>(&local_410,&local_414);
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_3f8,local_408,pFVar1,local_410);
  pPVar2 = local_18;
  pFVar1 = this->descriptor_;
  pOVar3 = Context::options(this->context_);
  Options::Options(&local_468,pOVar3);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,CLEARER,&local_468,true,false,false);
  Options::~Options(&local_468);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_478,
             "$deprecation$public Builder ${$clear$capitalized_name$$}$() {\n  copyOnWrite();\n  instance.clear$capitalized_name$();\n  return this;\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&this->variables_,local_478);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_488,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_498,"}");
  pFVar1 = this->descriptor_;
  local_4a4 = kSet;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>(&local_4a0,&local_4a4);
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_488,local_498,pFVar1,local_4a0);
  pPVar2 = local_18;
  pFVar1 = this->descriptor_;
  pOVar3 = Context::options(this->context_);
  Options::Options(&local_4f8,pOVar3);
  WriteFieldStringBytesAccessorDocComment(pPVar2,pFVar1,LIST_ADDER,&local_4f8,true,false,false);
  Options::~Options(&local_4f8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_508,
             "$deprecation$public Builder ${$add$capitalized_name$Bytes$}$(\n    com.google.protobuf.ByteString value) {\n  copyOnWrite();\n  instance.add$capitalized_name$Bytes(value);\n  return this;\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&this->variables_,local_508);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_518,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_528,"}");
  pFVar1 = this->descriptor_;
  local_534 = kSet;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>(&local_530,&local_534);
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_518,local_528,pFVar1,local_530);
  return;
}

Assistant:

void RepeatedImmutableStringFieldLiteGenerator::GenerateBuilderMembers(
    io::Printer* printer) const {
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_GETTER,
                               context_->options());
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public java.util.List<java.lang.String>\n"
                 "    ${$get$capitalized_name$List$}$() {\n"
                 "  return java.util.Collections.unmodifiableList(\n"
                 "      instance.get$capitalized_name$List());\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_COUNT,
                               context_->options());
  printer->Print(
      variables_,
      "@java.lang.Override\n"
      "$deprecation$public int ${$get$capitalized_name$Count$}$() {\n"
      "  return instance.get$capitalized_name$Count();\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_INDEXED_GETTER,
                               context_->options());
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public java.lang.String "
                 "${$get$capitalized_name$$}$(int index) {\n"
                 "  return instance.get$capitalized_name$(index);\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldStringBytesAccessorDocComment(
      printer, descriptor_, LIST_INDEXED_GETTER, context_->options());
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public com.google.protobuf.ByteString\n"
                 "    ${$get$capitalized_name$Bytes$}$(int index) {\n"
                 "  return instance.get$capitalized_name$Bytes(index);\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_INDEXED_SETTER,
                               context_->options(),
                               /* builder */ true);
  printer->Print(variables_,
                 "$deprecation$public Builder ${$set$capitalized_name$$}$(\n"
                 "    int index, java.lang.String value) {\n"
                 "  copyOnWrite();\n"
                 "  instance.set$capitalized_name$(index, value);\n"
                 "  return this;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_ADDER,
                               context_->options(),
                               /* builder */ true);
  printer->Print(variables_,
                 "$deprecation$public Builder ${$add$capitalized_name$$}$(\n"
                 "    java.lang.String value) {\n"
                 "  copyOnWrite();\n"
                 "  instance.add$capitalized_name$(value);\n"
                 "  return this;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_MULTI_ADDER,
                               context_->options(),
                               /* builder */ true);
  printer->Print(variables_,
                 "$deprecation$public Builder ${$addAll$capitalized_name$$}$(\n"
                 "    java.lang.Iterable<java.lang.String> values) {\n"
                 "  copyOnWrite();\n"
                 "  instance.addAll$capitalized_name$(values);\n"
                 "  return this;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);
  WriteFieldAccessorDocComment(printer, descriptor_, CLEARER,
                               context_->options(),
                               /* builder */ true);
  printer->Print(
      variables_,
      "$deprecation$public Builder ${$clear$capitalized_name$$}$() {\n"
      "  copyOnWrite();\n"
      "  instance.clear$capitalized_name$();\n"
      "  return this;\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);

  WriteFieldStringBytesAccessorDocComment(printer, descriptor_, LIST_ADDER,
                                          context_->options(),
                                          /* builder */ true);
  printer->Print(
      variables_,
      "$deprecation$public Builder ${$add$capitalized_name$Bytes$}$(\n"
      "    com.google.protobuf.ByteString value) {\n"
      "  copyOnWrite();\n"
      "  instance.add$capitalized_name$Bytes(value);\n"
      "  return this;\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);
}